

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TtStoreWrite(char *pFileName,Abc_TtStore_t *p,int fBinary)

{
  int iVar1;
  FILE *__stream;
  int local_41c;
  int nBytes;
  int i;
  char pBuffer [1000];
  FILE *pFile;
  int fBinary_local;
  Abc_TtStore_t *p_local;
  char *pFileName_local;
  
  iVar1 = Abc_Truth6WordNum(p->nVars);
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    for (local_41c = 0; local_41c < p->nFuncs; local_41c = local_41c + 1) {
      if (fBinary == 0) {
        Abc_TruthWriteHex((FILE *)__stream,p->pFuncs[local_41c],p->nVars);
        fprintf(__stream,"    ");
        Dau_DsdDecompose(p->pFuncs[local_41c],p->nVars,0,(uint)(p->nVars < 0xb),(char *)&nBytes);
        fprintf(__stream,"%s\n",&nBytes);
      }
      else {
        fwrite(p->pFuncs[local_41c],(long)(iVar1 << 3),1,__stream);
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Abc_TtStoreWrite( char * pFileName, Abc_TtStore_t * p, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    int i, nBytes = 8 * Abc_Truth6WordNum( p->nVars );
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( fBinary )
            fwrite( p->pFuncs[i], nBytes, 1, pFile );
        else
        {
            Abc_TruthWriteHex( pFile, p->pFuncs[i], p->nVars ), fprintf( pFile, "    " );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, (int)(p->nVars <= 10), pBuffer );
            fprintf( pFile, "%s\n", pBuffer );
        }
    }
    fclose( pFile );
}